

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiffInfo.cpp
# Opt level: O2

void __thiscall ApprovalTests::DiffInfo::DiffInfo(DiffInfo *this,string *program_,Type type_)

{
  ::std::__cxx11::string::string((string *)this,(string *)program_);
  getDefaultArguments_abi_cxx11_();
  this->type = type_;
  return;
}

Assistant:

DiffInfo::DiffInfo(std::string program_, Type type_)
        : program(std::move(program_)), arguments(getDefaultArguments()), type(type_)
    {
    }